

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O1

bool __thiscall
glcts::DrawBuffersIndexedColorMasks::VerifyImg
          (DrawBuffersIndexedColorMasks *this,TextureLevel *textureLevel,RGBA expectedColor,
          RGBA epsilon)

{
  int iVar1;
  bool bVar2;
  ChannelOrder CVar3;
  undefined4 uVar4;
  bool bVar5;
  ostream *poVar6;
  ChannelOrder CVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ChannelOrder CVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ChannelOrder CVar15;
  int iVar16;
  IVec4 color;
  bool local_1fe;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  iVar16 = (textureLevel->m_size).m_data[1];
  local_1fe = iVar16 < 1;
  if (0 < iVar16) {
    uVar12 = expectedColor.m_value >> 8 & 0xff;
    uVar13 = expectedColor.m_value >> 0x10 & 0xff;
    iVar16 = 0;
    local_1c8._16_8_ = this;
    do {
      iVar14 = (textureLevel->m_size).m_data[0];
      bVar2 = 0 < iVar14;
      if (0 < iVar14) {
        iVar14 = 0;
        do {
          tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,textureLevel);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1c8,(int)(ConstPixelBufferAccess *)local_1b0,
                     iVar14,iVar16);
          uVar4 = local_1c8._0_4_;
          CVar11 = local_1c8._4_4_ << 8 | local_1c8._0_4_;
          CVar15 = local_1c8._8_4_ << 0x10 | local_1c8._12_4_ << 0x18 | CVar11;
          bVar5 = true;
          if (CVar15 != expectedColor.m_value) {
            CVar7 = (local_1c8._0_4_ & 0xff) - (expectedColor.m_value & 0xff);
            CVar3 = -CVar7;
            if (0 < (int)CVar7) {
              CVar3 = CVar7;
            }
            iVar8 = (CVar11 >> 8 & 0xff) - uVar12;
            iVar1 = -iVar8;
            if (0 < iVar8) {
              iVar1 = iVar8;
            }
            iVar9 = (CVar15 >> 0x10 & 0xff) - uVar13;
            iVar8 = -iVar9;
            if (0 < iVar9) {
              iVar8 = iVar9;
            }
            iVar10 = (CVar15 >> 0x18) - (expectedColor.m_value >> 0x18);
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            local_1b0._0_4_ = iVar8 << 0x10 | iVar1 << 8 | CVar3 | iVar9 << 0x18;
            bVar5 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,epsilon);
          }
          if (bVar5 == false) {
            local_1b0 = (undefined1  [8])
                        ((((DrawBuffersIndexedBase *)local_1c8._16_8_)->super_TestCaseBase).
                         super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Expected value: ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RGBA(",5);
            poVar6 = (ostream *)std::ostream::operator<<(local_1a8,expectedColor.m_value & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,expectedColor.m_value >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Read value:     ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RGBA(",5);
            poVar6 = (ostream *)std::ostream::operator<<(local_1a8,uVar4 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,CVar11 >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,CVar15 >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,CVar15 >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Epsilon:        ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RGBA(",5);
            poVar6 = (ostream *)std::ostream::operator<<(local_1a8,epsilon.m_value & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,epsilon.m_value >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,epsilon.m_value >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,epsilon.m_value >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            if (bVar2) {
              return local_1fe;
            }
            break;
          }
          iVar14 = iVar14 + 1;
          iVar1 = (textureLevel->m_size).m_data[0];
          bVar2 = iVar14 < iVar1;
        } while (iVar14 < iVar1);
      }
      iVar16 = iVar16 + 1;
      iVar14 = (textureLevel->m_size).m_data[1];
      local_1fe = iVar14 <= iVar16;
    } while (iVar16 < iVar14);
  }
  return local_1fe;
}

Assistant:

bool DrawBuffersIndexedColorMasks::VerifyImg(const tcu::TextureLevel& textureLevel, tcu::RGBA expectedColor,
											 tcu::RGBA epsilon)
{
	for (int y = 0; y < textureLevel.getHeight(); ++y)
	{
		for (int x = 0; x < textureLevel.getWidth(); ++x)
		{
			tcu::IVec4 color(textureLevel.getAccess().getPixelInt(x, y));
			tcu::RGBA  pixel(color.x(), color.y(), color.z(), color.w());

			if (!tcu::compareThreshold(pixel, expectedColor, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected value: " << expectedColor << "\n"
								   << "Read value:     " << pixel << "\n"
								   << "Epsilon:        " << epsilon << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}
	return true;
}